

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O2

WrapMode glu::mapGLWrapMode(deUint32 wrapMode)

{
  WrapMode WVar1;
  InternalError *this;
  ulong local_60;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (wrapMode == 0x2901) {
    WVar1 = REPEAT_GL;
  }
  else if (wrapMode == 0x8370) {
    WVar1 = MIRRORED_REPEAT_GL;
  }
  else {
    WVar1 = CLAMP_TO_EDGE;
    if (wrapMode != 0x812f) {
      if (wrapMode != 0x812d) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        local_60 = (ulong)wrapMode;
        tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_58,&local_60);
        std::operator+(&local_38,"Can\'t map GL wrap mode ",&local_58);
        tcu::InternalError::InternalError(this,&local_38);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      WVar1 = CLAMP_TO_BORDER;
    }
  }
  return WVar1;
}

Assistant:

static inline tcu::Sampler::WrapMode mapGLWrapMode (deUint32 wrapMode)
{
	switch (wrapMode)
	{
		case GL_CLAMP_TO_EDGE:		return tcu::Sampler::CLAMP_TO_EDGE;
		case GL_CLAMP_TO_BORDER:	return tcu::Sampler::CLAMP_TO_BORDER;
		case GL_REPEAT:				return tcu::Sampler::REPEAT_GL;
		case GL_MIRRORED_REPEAT:	return tcu::Sampler::MIRRORED_REPEAT_GL;
		default:
			throw tcu::InternalError("Can't map GL wrap mode " + tcu::toHex(wrapMode).toString());
	}
}